

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

string * __thiscall
punky::lex::Lexer::tokenize_identifier_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char ch;
  pointer pcVar4;
  
  pcVar1 = (this->m_curr_it)._M_current;
  ch = this->m_curr_char;
  while( true ) {
    bVar3 = utils::is_letter(ch);
    if (!bVar3) break;
    pcVar4 = (this->m_curr_it)._M_current + 1;
    if (pcVar4 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) {
      ch = '\0';
    }
    else {
      (this->m_curr_it)._M_current = pcVar4;
      ch = *pcVar4;
    }
    this->m_curr_char = ch;
  }
  pcVar2 = (this->m_curr_it)._M_current;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar1,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::tokenize_identifier()
{
    const auto ident_begin = m_curr_it;
    while (utils::is_letter(m_curr_char))
        consume();
    return std::string{ident_begin, m_curr_it};
}